

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat * __thiscall Mat::transpose(Mat *__return_storage_ptr__,Mat *this)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  pointer p_Var4;
  pointer p_Var5;
  long lVar6;
  pointer p_Var7;
  long lVar8;
  
  Mat(__return_storage_ptr__,this->c,this->r);
  lVar3 = (long)this->r;
  if (0 < lVar3) {
    uVar1 = this->c;
    p_Var4 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var5 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar8 = 0;
        p_Var7 = p_Var4;
        do {
          uVar2 = *(undefined8 *)((long)p_Var7 + 8);
          *(undefined8 *)((long)p_Var5 + lVar8) = (long)*p_Var7;
          ((undefined8 *)((long)p_Var5 + lVar8))[1] = uVar2;
          lVar8 = lVar8 + 0x10;
          p_Var7 = p_Var7 + lVar3;
        } while ((ulong)uVar1 * 0x10 != lVar8);
      }
      lVar6 = lVar6 + 1;
      p_Var5 = p_Var5 + uVar1;
      p_Var4 = p_Var4 + 1;
    } while (lVar6 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::transpose() const {
    Mat ret(c, r);
    for (int i = 0; i < r; i++) {
        for (int j = 0; j < c; j++) {
            ret.val[i * c + j] = val[j * r + i];
        }
    }
    return ret;
}